

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O3

bool CommaSeparateAndAddOccurrence
               (Option *Handler,uint pos,StringRef ArgName,StringRef Value,bool MultiArg)

{
  int iVar1;
  void *pvVar2;
  char *__s;
  ulong uVar3;
  ulong uVar4;
  size_t __n;
  
  __n = Value.Length;
  __s = Value.Data;
  if ((Handler->field_0xd & 2) != 0) {
    if (__n == 0) {
LAB_00116e20:
      __n = 0;
    }
    else {
      pvVar2 = memchr(__s,0x2c,__n);
      uVar4 = (long)pvVar2 - (long)__s;
      if (uVar4 != 0xffffffffffffffff && pvVar2 != (void *)0x0) {
        do {
          uVar3 = uVar4;
          if (__n < uVar4) {
            uVar3 = __n;
          }
          iVar1 = (*Handler->_vptr_Option[10])
                            (Handler,pos,ArgName.Data,ArgName.Length,__s,uVar3,(uint)MultiArg);
          if ((char)iVar1 != '\0') {
            return true;
          }
          uVar3 = uVar4 + 1;
          if (__n < uVar4 + 1) {
            uVar3 = __n;
          }
          __s = __s + uVar3;
          __n = __n - uVar3;
          if (__n == 0) goto LAB_00116e20;
          pvVar2 = memchr(__s,0x2c,__n);
        } while ((pvVar2 != (void *)0x0) &&
                (uVar4 = (long)pvVar2 - (long)__s, uVar4 != 0xffffffffffffffff));
      }
    }
  }
  iVar1 = (*Handler->_vptr_Option[10])(Handler,pos,ArgName.Data,ArgName.Length,__s,__n);
  return SUB41(iVar1,0);
}

Assistant:

static bool CommaSeparateAndAddOccurrence(Option *Handler, unsigned pos,
                                          StringRef ArgName, StringRef Value,
                                          bool MultiArg = false) {
  // Check to see if this option accepts a comma separated list of values.  If
  // it does, we have to split up the value into multiple values.
  if (Handler->getMiscFlags() & CommaSeparated) {
    StringRef Val(Value);
    StringRef::size_type Pos = Val.find(',');

    while (Pos != StringRef::npos) {
      // Process the portion before the comma.
      if (Handler->addOccurrence(pos, ArgName, Val.substr(0, Pos), MultiArg))
        return true;
      // Erase the portion before the comma, AND the comma.
      Val = Val.substr(Pos + 1);
      // Check for another comma.
      Pos = Val.find(',');
    }

    Value = Val;
  }

  return Handler->addOccurrence(pos, ArgName, Value, MultiArg);
}